

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O2

void __thiscall viface::VIfaceImpl::VIfaceImpl(VIfaceImpl *this,string *name,bool tap,int id)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  unsigned_long uVar7;
  runtime_error *prVar8;
  ostream *poVar9;
  int *piVar10;
  char *pcVar11;
  invalid_argument *this_00;
  long lVar12;
  viface_queues queues;
  ifreq ifr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_238;
  string *local_230;
  char *local_228 [4];
  char *local_208 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  ostringstream what;
  string local_50 [32];
  
  (this->pktbuff).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pktbuff).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pktbuff).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->mac)._M_dataplus._M_p = (pointer)&(this->mac).field_2;
  (this->mac)._M_string_length = 0;
  (this->mac).field_2._M_local_buf[0] = '\0';
  (this->ipv4)._M_dataplus._M_p = (pointer)&(this->ipv4).field_2;
  (this->ipv4)._M_string_length = 0;
  (this->ipv4).field_2._M_local_buf[0] = '\0';
  (this->netmask)._M_dataplus._M_p = (pointer)&(this->netmask).field_2;
  (this->netmask)._M_string_length = 0;
  (this->netmask).field_2._M_local_buf[0] = '\0';
  (this->broadcast)._M_dataplus._M_p = (pointer)&(this->broadcast).field_2;
  (this->broadcast)._M_string_length = 0;
  (this->broadcast).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->ipv6s)._M_t._M_impl.super__Rb_tree_header;
  (this->ipv6s)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ipv6s)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ipv6s)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ipv6s)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ipv6s)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header;
  (this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->stats_cache)._M_t._M_impl.super__Rb_tree_header;
  (this->stats_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stats_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stats_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->stats_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->stats_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_238 = &this->pktbuff;
  if (0xf < name->_M_string_length) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"--- Virtual interface name too long.");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  queues.rx = 0;
  queues.tx = 0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&what,
                 "/sys/class/net/",name);
  iVar3 = access(_what,0);
  std::__cxx11::string::~string((string *)&what);
  if (iVar3 != 0) {
    std::__cxx11::string::string((string *)local_228,(string *)name);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&what);
    ifr.ifr_ifrn._8_8_ = 0;
    ifr.ifr_ifru.ifru_map.mem_end = 0;
    ifr.ifr_ifru._16_8_ = 0;
    ifr.ifr_ifru.ifru_map.mem_start._2_6_ = 0;
    ifr.ifr_ifru.ifru_addr.sa_family = tap + 0x1101;
    strncpy((char *)&ifr,local_228[0],0xf);
    for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
      iVar3 = open("/dev/net/tun",0x802);
      iVar5 = (int)lVar12;
      if (iVar3 < 0) {
        poVar9 = std::operator<<((ostream *)&what,"--- Unable to open TUN/TAP device.");
        std::endl<char,std::char_traits<char>>(poVar9);
        poVar9 = std::operator<<((ostream *)&what,"    Name: ");
        poVar9 = std::operator<<(poVar9,(string *)local_228);
        poVar9 = std::operator<<(poVar9," Queue: ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
        std::endl<char,std::char_traits<char>>(poVar9);
        poVar9 = std::operator<<((ostream *)&what,"    Error: ");
        piVar10 = __errno_location();
        pcVar11 = strerror(*piVar10);
        std::operator<<(poVar9,pcVar11);
        poVar9 = std::operator<<((ostream *)&what," (");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,*piVar10);
        poVar9 = std::operator<<(poVar9,").");
        std::endl<char,std::char_traits<char>>(poVar9);
LAB_001095ff:
        if (iVar5 == 1) {
          iVar3 = close(queues.rx);
          if (iVar3 < 0) {
            poVar9 = std::operator<<((ostream *)&what,"--- Unable to close a TUN/TAP device.");
            std::endl<char,std::char_traits<char>>(poVar9);
            poVar9 = std::operator<<((ostream *)&what,"    Name: ");
            poVar9 = std::operator<<(poVar9,(string *)local_228);
            poVar9 = std::operator<<(poVar9," Queue: ");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
            std::endl<char,std::char_traits<char>>(poVar9);
            poVar9 = std::operator<<((ostream *)&what,"    Error: ");
            piVar10 = __errno_location();
            pcVar11 = strerror(*piVar10);
            std::operator<<(poVar9,pcVar11);
            poVar9 = std::operator<<((ostream *)&what," (");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,*piVar10);
            poVar9 = std::operator<<(poVar9,").");
            std::endl<char,std::char_traits<char>>(poVar9);
          }
        }
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,(string *)&local_258);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar4 = ioctl(iVar3,0x400454ca,&ifr);
      if (iVar4 != 0) {
        poVar9 = std::operator<<((ostream *)&what,"--- Unable to register a TUN/TAP device.");
        std::endl<char,std::char_traits<char>>(poVar9);
        poVar9 = std::operator<<((ostream *)&what,"    Name: ");
        poVar9 = std::operator<<(poVar9,(string *)local_228);
        poVar9 = std::operator<<(poVar9," Queue: ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
        std::endl<char,std::char_traits<char>>(poVar9);
        poVar9 = std::operator<<((ostream *)&what,"    Error: ");
        piVar10 = __errno_location();
        pcVar11 = strerror(*piVar10);
        std::operator<<(poVar9,pcVar11);
        poVar9 = std::operator<<((ostream *)&what," (");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,*piVar10);
        poVar9 = std::operator<<(poVar9,").");
        std::endl<char,std::char_traits<char>>(poVar9);
        iVar3 = close(iVar3);
        if (iVar3 < 0) {
          poVar9 = std::operator<<((ostream *)&what,"--- Unable to close a TUN/TAP device.");
          std::endl<char,std::char_traits<char>>(poVar9);
          poVar9 = std::operator<<((ostream *)&what,"    Name: ");
          poVar9 = std::operator<<(poVar9,(string *)local_228);
          poVar9 = std::operator<<(poVar9," Queue: ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
          std::endl<char,std::char_traits<char>>(poVar9);
          poVar9 = std::operator<<((ostream *)&what,"    Error: ");
          pcVar11 = strerror(*piVar10);
          std::operator<<(poVar9,pcVar11);
          poVar9 = std::operator<<((ostream *)&what," (");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,*piVar10);
          poVar9 = std::operator<<(poVar9,").");
          std::endl<char,std::char_traits<char>>(poVar9);
        }
        goto LAB_001095ff;
      }
      (&queues.rx)[lVar12] = iVar3;
    }
    std::__cxx11::string::string(local_50,(char *)&ifr,(allocator *)&local_258);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&what);
    std::__cxx11::string::operator=((string *)&this->name,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)local_228);
    this->mtu = 0x5dc;
LAB_001094c2:
    this->queues = queues;
    this->kernel_socket = -1;
    iVar3 = socket(2,1,0);
    this->kernel_socket = iVar3;
    if (iVar3 < 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&what);
      std::operator<<((ostream *)&what,"--- Unable to create IPv4 socket channel to the NET kernel."
                     );
      std::endl<char,std::char_traits<char>>((ostream *)&what);
      poVar9 = std::operator<<((ostream *)&what,"    Error: ");
      piVar10 = __errno_location();
      pcVar11 = strerror(*piVar10);
      std::operator<<(poVar9,pcVar11);
      poVar9 = std::operator<<((ostream *)&what," (");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*piVar10);
      poVar9 = std::operator<<(poVar9,").");
      std::endl<char,std::char_traits<char>>(poVar9);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&ifr);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->kernel_socket_ipv6 = -1;
    iVar3 = socket(10,1,0);
    this->kernel_socket_ipv6 = iVar3;
    if (-1 < iVar3) {
      if (id < 0) {
        id = idseq;
      }
      this->id = id;
      idseq = idseq + 1;
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&what);
    std::operator<<((ostream *)&what,"--- Unable to create IPv6 socket channel to the NET kernel.");
    std::endl<char,std::char_traits<char>>((ostream *)&what);
    poVar9 = std::operator<<((ostream *)&what,"    Error: ");
    piVar10 = __errno_location();
    pcVar11 = strerror(*piVar10);
    std::operator<<(poVar9,pcVar11);
    poVar9 = std::operator<<((ostream *)&what," (");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,*piVar10);
    poVar9 = std::operator<<(poVar9,").");
    std::endl<char,std::char_traits<char>>(poVar9);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&ifr);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)local_208,(string *)name);
  local_230 = name;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&what);
  for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
    iVar3 = socket(0x11,3,0x300);
    iVar5 = (int)lVar12;
    if (iVar3 < 0) {
      poVar9 = std::operator<<((ostream *)&what,"--- Unable to create the Tx/Rx socket channel.");
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&what,"    Name: ");
      poVar9 = std::operator<<(poVar9,(string *)local_208);
      poVar9 = std::operator<<(poVar9," Queue: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&what,"    Error: ");
      piVar10 = __errno_location();
      pcVar11 = strerror(*piVar10);
      std::operator<<(poVar9,pcVar11);
      poVar9 = std::operator<<((ostream *)&what," (");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*piVar10);
      poVar9 = std::operator<<(poVar9,").");
      std::endl<char,std::char_traits<char>>(poVar9);
LAB_00109b39:
      if (iVar5 == 1) {
        iVar3 = close(queues.rx);
        if (iVar3 < 0) {
          poVar9 = std::operator<<((ostream *)&what,"--- Unable to close a Rx/Tx socket.");
          std::endl<char,std::char_traits<char>>(poVar9);
          poVar9 = std::operator<<((ostream *)&what,"    Name: ");
          poVar9 = std::operator<<(poVar9,(string *)local_208);
          poVar9 = std::operator<<(poVar9," Queue: ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
          std::endl<char,std::char_traits<char>>(poVar9);
          poVar9 = std::operator<<((ostream *)&what,"    Error: ");
          piVar10 = __errno_location();
          pcVar11 = strerror(*piVar10);
          std::operator<<(poVar9,pcVar11);
          poVar9 = std::operator<<((ostream *)&what," (");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,*piVar10);
          poVar9 = std::operator<<(poVar9,").");
          std::endl<char,std::char_traits<char>>(poVar9);
        }
      }
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&ifr);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ifr.ifr_ifru.ifru_map.mem_start = 0;
    ifr.ifr_ifru.ifru_map.mem_end = 0;
    ifr.ifr_ifrn._0_8_ = 0;
    ifr.ifr_ifrn._8_8_ = 0;
    ifr.ifr_ifru._16_8_ = 0;
    strncpy((char *)&ifr,local_208[0],0xf);
    iVar4 = ioctl(iVar3,0x8933,&ifr);
    if (iVar4 != 0) {
      std::operator<<((ostream *)&what,"--- Unable to get network index number.");
      poVar9 = std::operator<<((ostream *)&what,"    Name: ");
      poVar9 = std::operator<<(poVar9,(string *)local_208);
      poVar9 = std::operator<<(poVar9," Queue: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&what,"    Error: ");
      piVar10 = __errno_location();
      pcVar11 = strerror(*piVar10);
      std::operator<<(poVar9,pcVar11);
      poVar9 = std::operator<<((ostream *)&what," (");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*piVar10);
      poVar9 = std::operator<<(poVar9,").");
      std::endl<char,std::char_traits<char>>(poVar9);
      goto LAB_00109b39;
    }
    local_258.field_2._M_allocated_capacity._0_4_ = 0;
    local_258._M_string_length = 0;
    local_258._M_dataplus._M_p._0_4_ = 0x3000011;
    local_258._M_dataplus._M_p._4_4_ = ifr.ifr_ifru.ifru_ivalue;
    iVar4 = bind(iVar3,(sockaddr *)&local_258,0x14);
    if (iVar4 != 0) {
      std::operator<<((ostream *)&what,"--- Unable to bind the Tx/Rx socket channel to the \'");
      poVar9 = std::operator<<((ostream *)&what,(string *)local_208);
      poVar9 = std::operator<<(poVar9,"\' network interface.");
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&what,"    Queue: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
      poVar9 = std::operator<<(poVar9,".");
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&what,"    Error: ");
      piVar10 = __errno_location();
      pcVar11 = strerror(*piVar10);
      std::operator<<(poVar9,pcVar11);
      poVar9 = std::operator<<((ostream *)&what," (");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*piVar10);
      poVar9 = std::operator<<(poVar9,").");
      std::endl<char,std::char_traits<char>>(poVar9);
      goto LAB_00109b39;
    }
    (&queues.rx)[lVar12] = iVar3;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&what);
  std::__cxx11::string::~string((string *)local_208);
  psVar2 = local_230;
  std::__cxx11::string::_M_assign((string *)&this->name);
  std::__cxx11::string::string((string *)&local_1e8,(string *)psVar2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&what);
  std::operator+(&local_258,"/sys/class/net/",&local_1e8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifr,
                 &local_258,"/mtu");
  iVar3 = open((char *)ifr.ifr_ifrn._0_8_,0x800);
  std::__cxx11::string::~string((string *)&ifr);
  std::__cxx11::string::~string((string *)&local_258);
  if (iVar3 < 0) {
    std::operator<<((ostream *)&what,"--- Unable to open MTU file for \'");
    poVar9 = std::operator<<((ostream *)&what,(string *)&local_1e8);
    poVar9 = std::operator<<(poVar9,"\' network interface.");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&what,"    Error: ");
    piVar10 = __errno_location();
    pcVar11 = strerror(*piVar10);
    std::operator<<(poVar9,pcVar11);
    poVar9 = std::operator<<((ostream *)&what," (");
  }
  else {
    sVar6 = read(iVar3,&local_258,4);
    local_258._M_dataplus._M_p._4_4_ = local_258._M_dataplus._M_p._4_4_ & 0xffffff00;
    if ((int)sVar6 == -1) {
      std::operator<<((ostream *)&what,"--- Unable to read MTU for \'");
      poVar9 = std::operator<<((ostream *)&what,(string *)&local_1e8);
      poVar9 = std::operator<<(poVar9,"\' network interface.");
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&what,"    Error: ");
      piVar10 = __errno_location();
      pcVar11 = strerror(*piVar10);
      std::operator<<(poVar9,pcVar11);
      poVar9 = std::operator<<((ostream *)&what," (");
    }
    else {
      iVar5 = close(iVar3);
      if (-1 < iVar5) {
        std::__cxx11::string::string((string *)&ifr,(char *)&local_258,(allocator *)local_50);
        uVar7 = std::__cxx11::stoul((string *)&ifr,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&ifr);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&what);
        this->mtu = (uint)uVar7;
        std::__cxx11::string::~string((string *)&local_1e8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (local_238,(ulong)this->mtu);
        goto LAB_001094c2;
      }
      std::operator<<((ostream *)&what,"--- Unable to close MTU file for \'");
      poVar9 = std::operator<<((ostream *)&what,(string *)&local_1e8);
      poVar9 = std::operator<<(poVar9,"\' network interface.");
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&what,"    Error: ");
      piVar10 = __errno_location();
      pcVar11 = strerror(*piVar10);
      std::operator<<(poVar9,pcVar11);
      poVar9 = std::operator<<((ostream *)&what," (");
    }
  }
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,*piVar10);
  poVar9 = std::operator<<(poVar9,").");
  std::endl<char,std::char_traits<char>>(poVar9);
  close(iVar3);
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar8,(string *)&ifr);
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

VIfaceImpl::VIfaceImpl(string name, bool tap, int id)
{
    // Check name length
    if (name.length() >= IFNAMSIZ) {
        throw invalid_argument("--- Virtual interface name too long.");
    }

    // Create queues
    struct viface_queues queues;
    memset(&queues, 0, sizeof(struct viface_queues));

    /* Checks if the path name can be accessed. If so,
     * it means that the network interface is already defined.
     */
    if (access(("/sys/class/net/" + name).c_str(), F_OK) == 0) {
        hook_viface(name, &queues);
        this->name = name;

        // Read MTU value and resize buffer
        this->mtu = read_mtu(name, sizeof(this->mtu));
        this->pktbuff.resize(this->mtu);
    } else {
        this->name = alloc_viface(name, tap, &queues);

        // Other defaults
        this->mtu = 1500;
    }

    this->queues = queues;

    // Create socket channels to the NET kernel for later ioctl
    this->kernel_socket = -1;
    this->kernel_socket = socket(AF_INET, SOCK_STREAM, 0);
    if (this->kernel_socket < 0) {
        ostringstream what;
        what << "--- Unable to create IPv4 socket channel to the NET kernel.";
        what << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    this->kernel_socket_ipv6 = -1;
    this->kernel_socket_ipv6 = socket(AF_INET6, SOCK_STREAM, 0);
    if (this->kernel_socket_ipv6 < 0) {
        ostringstream what;
        what << "--- Unable to create IPv6 socket channel to the NET kernel.";
        what << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    // Set id
    if (id < 0) {
        this->id = this->idseq;
    } else {
        this->id = id;
    }
    this->idseq++;
}